

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetCompileDefinitionsCommand.cxx
# Opt level: O3

string * __thiscall
cmTargetCompileDefinitionsCommand::Join
          (string *__return_storage_ptr__,cmTargetCompileDefinitionsCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  long *plVar3;
  size_type *psVar4;
  undefined8 uVar5;
  _Alloc_hider _Var6;
  pointer __rhs;
  string sep;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50 [2];
  size_type local_40 [2];
  
  local_78 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_78;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  __rhs = (content->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if (__rhs != (content->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish) {
    paVar1 = &local_98.field_2;
    do {
      pcVar2 = (__rhs->_M_dataplus)._M_p;
      if ((*pcVar2 == '-') && (pcVar2[1] == 'D')) {
        std::__cxx11::string::substr((ulong)local_50,(ulong)__rhs);
        plVar3 = (long *)std::__cxx11::string::replace
                                   ((ulong)local_50,0,(char *)0x0,(ulong)local_70._M_dataplus._M_p);
        psVar4 = (size_type *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar4) {
          local_98.field_2._M_allocated_capacity = *psVar4;
          local_98.field_2._8_8_ = plVar3[3];
          local_98._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_98.field_2._M_allocated_capacity = *psVar4;
          local_98._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_98._M_string_length = plVar3[1];
        *plVar3 = (long)psVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_98._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != paVar1) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        uVar5 = local_40[0];
        _Var6._M_p = (pointer)local_50[0];
        if (local_50[0] !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40) {
LAB_00384f70:
          operator_delete(_Var6._M_p,uVar5 + 1);
        }
      }
      else {
        std::operator+(&local_98,&local_70,__rhs);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_98._M_dataplus._M_p);
        uVar5 = local_98.field_2._M_allocated_capacity;
        _Var6._M_p = local_98._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != paVar1) goto LAB_00384f70;
      }
      std::__cxx11::string::_M_replace
                ((ulong)&local_70,0,(char *)local_70._M_string_length,0x50817e);
      __rhs = __rhs + 1;
    } while (__rhs != (content->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmTargetCompileDefinitionsCommand
::Join(const std::vector<std::string> &content)
{
  std::string defs;
  std::string sep;
  for(std::vector<std::string>::const_iterator it = content.begin();
    it != content.end(); ++it)
    {
    if (cmHasLiteralPrefix(it->c_str(), "-D"))
      {
      defs += sep + it->substr(2);
      }
    else
      {
      defs += sep + *it;
      }
    sep = ";";
    }
  return defs;
}